

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

bool console::readline_simple(string *line,bool multiline_input)

{
  istream *piVar1;
  ulong uVar2;
  char *pcVar3;
  byte in_SIL;
  string *in_RDI;
  char last;
  bool local_11;
  bool local_1;
  
  local_11 = (bool)(in_SIL & 1);
  piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)&std::cin,in_RDI);
  uVar2 = std::ios::operator!((ios *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18)));
  if ((uVar2 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::back();
      if (*pcVar3 == '/') {
        std::__cxx11::string::pop_back();
        return false;
      }
      if (*pcVar3 == '\\') {
        std::__cxx11::string::pop_back();
        local_11 = (bool)((local_11 ^ 0xffU) & 1);
      }
    }
    std::__cxx11::string::operator+=(in_RDI,'\n');
    local_1 = local_11;
  }
  else {
    std::__cxx11::string::clear();
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool readline_simple(std::string & line, bool multiline_input) {
#if defined(_WIN32)
        std::wstring wline;
        if (!std::getline(std::wcin, wline)) {
            // Input stream is bad or EOF received
            line.clear();
            GenerateConsoleCtrlEvent(CTRL_C_EVENT, 0);
            return false;
        }

        int size_needed = WideCharToMultiByte(CP_UTF8, 0, &wline[0], (int)wline.size(), NULL, 0, NULL, NULL);
        line.resize(size_needed);
        WideCharToMultiByte(CP_UTF8, 0, &wline[0], (int)wline.size(), &line[0], size_needed, NULL, NULL);
#else
        if (!std::getline(std::cin, line)) {
            // Input stream is bad or EOF received
            line.clear();
            return false;
        }
#endif
        if (!line.empty()) {
            char last = line.back();
            if (last == '/') { // Always return control on '/' symbol
                line.pop_back();
                return false;
            }
            if (last == '\\') { // '\\' changes the default action
                line.pop_back();
                multiline_input = !multiline_input;
            }
        }
        line += '\n';

        // By default, continue input if multiline_input is set
        return multiline_input;
    }